

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_array.h
# Opt level: O0

void __thiscall
cert::DynamicArray<cert::Material_*>::push_back
          (DynamicArray<cert::Material_*> *this,Material *value)

{
  size_t sVar1;
  int new_val_index;
  Material *value_local;
  DynamicArray<cert::Material_*> *this_local;
  
  sVar1 = this->m_size;
  if (this->m_allocated <= this->m_size) {
    reserve(this,this->m_allocated << 1);
  }
  this->m_data[(int)sVar1] = value;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

constexpr void push_back (T value)
	{
		int new_val_index = m_size;
		if (m_size >= m_allocated)
		{
			reserve (2 * m_allocated);
		}
		m_data[new_val_index] = value;
		m_size++;
	}